

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall Printer::~Printer(Printer *this)

{
  int local_14;
  int i;
  Printer *this_local;
  
  for (local_14 = 0; local_14 < this->attrCount; local_14 = local_14 + 1) {
    if (this->psHeader[local_14] != (char *)0x0) {
      operator_delete__(this->psHeader[local_14]);
    }
  }
  if (this->spaces != (int *)0x0) {
    operator_delete__(this->spaces);
  }
  free(this->psHeader);
  if (this->attributes != (DataAttrInfo *)0x0) {
    operator_delete__(this->attributes);
  }
  return;
}

Assistant:

Printer::~Printer()
{
    for (int i = 0; i < attrCount; i++)
        delete [] psHeader[i];

    delete [] spaces;
    //delete [] psHeader;
    free (psHeader);
    delete [] attributes;
}